

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

bool __thiscall
Potassco::AspifTextOutput::assignAtomName(AspifTextOutput *this,Atom_t atom,string *str)

{
  char cVar1;
  uint uVar2;
  StringMapNode node;
  size_t __n;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  pointer pppVar6;
  char *pcVar7;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
  _Var8;
  Data *pDVar9;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar10;
  value_type local_58 [4];
  Atom_t local_38;
  
  if (atom <= this->maxAtom_) {
    return false;
  }
  cVar1 = *(str->_M_dataplus)._M_p;
  uVar4 = (ulong)atom;
  pDVar9 = this->data_;
  pppVar6 = (pDVar9->atoms).
            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pDVar9->atoms).
                    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pppVar6 >> 3) <= uVar4) {
    local_58[0] = (value_type)0x0;
    std::
    vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
    ::resize(&pDVar9->atoms,(ulong)(atom + 1),local_58);
    pDVar9 = this->data_;
    pppVar6 = (pDVar9->atoms).
              super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  node = pppVar6[uVar4];
  if (node != (StringMapNode)0x0) {
    if ((node->second == atom) &&
       (__n = (node->first)._M_string_length, __n == str->_M_string_length)) {
      if (__n == 0) {
        return true;
      }
      iVar5 = bcmp((node->first)._M_dataplus._M_p,(str->_M_dataplus)._M_p,__n);
      if (iVar5 == 0) {
        return true;
      }
    }
    Data::convertToOutput(pDVar9,node);
    if (cVar1 != '&') {
      return false;
    }
  }
  pcVar3 = (str->_M_dataplus)._M_p;
  if (((2 < str->_M_string_length) && (*pcVar3 == 'x')) && (pcVar3[1] == '_')) {
    pcVar7 = pcVar3 + 2;
    do {
      cVar1 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while ((byte)(cVar1 - 0x30U) < 10);
    if (cVar1 == '\0') goto LAB_0010af69;
  }
  pDVar9 = this->data_;
  local_58[0] = (value_type)(local_58 + 2);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar3,pcVar3 + str->_M_string_length);
  local_38 = atom;
  pVar10 = std::
           _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
           ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_int>>
                     ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       *)&pDVar9->strings,(string *)local_58);
  _Var8 = pVar10.first.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
          ._M_cur;
  if (local_58[0] != (value_type)(local_58 + 2)) {
    operator_delete(local_58[0]);
  }
  uVar2 = *(uint *)((long)_Var8.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                          ._M_cur + 0x28);
  if (uVar2 == atom || uVar2 == 0xffffffff) {
    *(Atom_t *)
     ((long)_Var8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
            ._M_cur + 0x28) = atom;
    (this->data_->atoms).
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar4] =
         (StringMapNode)
         ((long)_Var8.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                ._M_cur + 8);
    return true;
  }
  if (this->maxAtom_ < uVar2) {
    Data::convertToOutput
              (this->data_,
               (StringMapNode)
               ((long)_Var8.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                      ._M_cur + 8));
  }
LAB_0010af69:
  Data::setGenName(this->data_,atom);
  return false;
}

Assistant:

bool AspifTextOutput::assignAtomName(Atom_t atom, const std::string& str) {
	if (atom <= maxAtom_) {
		return false;
	}
	assert(!str.empty());
	bool theory = str[0] == '&';
	if (atom >= data_->atoms.size()) { data_->atoms.resize(atom + 1, 0); }
	if (Data::StringMapNode node = data_->atoms[atom]) { // atom already has a tentative name
		if (node->second == atom && node->first == str) {
			return true; // identical name, ignore duplicate
		}
		data_->convertToOutput(node); // drop assignment
		if (!theory) {
			return false;
		}
	}
	if (str.size() > 2 && str[0] == 'x' && str[1] == '_') {
		const char* x = str.c_str() + 2;
		while (BufferedStream::isDigit(*x)) { ++x; }
		if (!*x) {
			data_->setGenName(atom);
			return false;
		}
	}
	Data::StringMapNode node = &*data_->strings.insert(Data::StringMapVal(str, atom)).first;
	if (node->second == atom || node->second == idMax) { // assign tentative name to atom
		node->second       = atom;
		data_->atoms[atom] = node;
		return true;
	}
	// name already used: drop previous (tentative) assigment and prevent further assignments
	if (node->second > maxAtom_) {
		data_->convertToOutput(node);
	}
	data_->setGenName(atom);
	return false;
}